

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMathExc.cpp
# Opt level: O0

void anon_unknown.dwarf_10923::test2(void)

{
  ostream *this;
  int i;
  int local_4;
  
  this = std::operator<<((ostream *)&std::cout,"invalid operations / exception handling on");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Iex_3_2::mathExcOn(0x15);
  for (local_4 = 0; local_4 < 3; local_4 = local_4 + 1) {
    test2a();
    test2b();
    test2c();
  }
  return;
}

Assistant:

void
test2 ()
{
    //
    // Turn math exception handling on, and verify that C++ exceptions
    // are thrown when "exceptional" floating-point operations are
    // performed.
    //

    std::cout << "invalid operations / exception handling on" << std::endl;

    IEX_INTERNAL_NAMESPACE::mathExcOn (IEX_INTERNAL_NAMESPACE::IEEE_OVERFLOW | IEX_INTERNAL_NAMESPACE::IEEE_DIVZERO | IEX_INTERNAL_NAMESPACE::IEEE_INVALID);

    for (int i = 0; i < 3; ++i)
    {
        test2a();
	test2b();
	test2c();
    }
}